

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

UCollator * ucol_safeClone_63(UCollator *coll,void *param_2,int32_t *pBufferSize,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  Collator *pCVar3;
  undefined4 extraout_var;
  Collator *newColl;
  int32_t inputSize;
  UErrorCode *status_local;
  int32_t *pBufferSize_local;
  void *param_1_local;
  UCollator *coll_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    coll_local = (UCollator *)0x0;
  }
  else if (coll == (UCollator *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    coll_local = (UCollator *)0x0;
  }
  else if ((pBufferSize == (int32_t *)0x0) || (iVar2 = *pBufferSize, *pBufferSize = 1, iVar2 != 0))
  {
    pCVar3 = icu_63::Collator::fromUCollator(coll);
    iVar2 = (*(pCVar3->super_UObject)._vptr_UObject[5])();
    if ((Collator *)CONCAT44(extraout_var,iVar2) == (Collator *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      coll_local = (UCollator *)0x0;
    }
    else {
      *status = U_SAFECLONE_ALLOCATED_WARNING;
      coll_local = icu_63::Collator::toUCollator((Collator *)CONCAT44(extraout_var,iVar2));
    }
  }
  else {
    coll_local = (UCollator *)0x0;
  }
  return coll_local;
}

Assistant:

U_CAPI UCollator* U_EXPORT2
ucol_safeClone(const UCollator *coll, void * /*stackBuffer*/, int32_t * pBufferSize, UErrorCode *status)
{
    if (status == NULL || U_FAILURE(*status)){
        return NULL;
    }
    if (coll == NULL) {
       *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if (pBufferSize != NULL) {
        int32_t inputSize = *pBufferSize;
        *pBufferSize = 1;
        if (inputSize == 0) {
            return NULL;  // preflighting for deprecated functionality
        }
    }
    Collator *newColl = Collator::fromUCollator(coll)->clone();
    if (newColl == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    } else {
        *status = U_SAFECLONE_ALLOCATED_WARNING;
    }
    return newColl->toUCollator();
}